

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O2

ModelWireSegment * __thiscall lsim::ModelWire::add_segment(ModelWire *this,Point *p0,Point *p1)

{
  ModelWireSegment *segment;
  ModelWireJunction *pMVar1;
  unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> uStack_38;
  ModelWire *local_30;
  
  local_30 = this;
  std::make_unique<lsim::ModelWireSegment,lsim::ModelWire*>((ModelWire **)&uStack_38);
  std::
  vector<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>,std::allocator<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>>>
  ::
  emplace_back<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>>
            ((vector<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>,std::allocator<std::unique_ptr<lsim::ModelWireSegment,std::default_delete<lsim::ModelWireSegment>>>>
              *)&this->m_segments,&uStack_38);
  std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>::~unique_ptr
            (&uStack_38);
  segment = (this->m_segments).
            super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
            super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
            ._M_t.
            super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
            .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl;
  pMVar1 = add_junction(this,p0,segment);
  (segment->m_ends)._M_elems[0] = pMVar1;
  pMVar1 = add_junction(this,p1,segment);
  *(ModelWireJunction **)((long)(segment->m_ends)._M_elems + 8) = pMVar1;
  return segment;
}

Assistant:

ModelWireSegment *ModelWire::add_segment(const Point &p0, const Point &p1) {
    m_segments.push_back(std::make_unique<ModelWireSegment>(this));
    auto segment = m_segments.back().get();

    segment->set_junction(0, add_junction(p0, segment));
    segment->set_junction(1, add_junction(p1, segment));
    return segment;
}